

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::InsertToVarAtDefInTryRegion(GlobOpt *this,Instr *instr,Opnd *dstOpnd)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  StackSym *sym;
  Region *pRVar6;
  RegOpnd *regOpnd;
  RegionType RVar7;
  
  RVar7 = this->currentRegion->type;
  if ((RVar7 == RegionTypeFinally) || (RVar7 == RegionTypeTry)) {
    OVar2 = IR::Opnd::GetKind(dstOpnd);
    if (OVar2 != OpndKindReg) {
      return;
    }
    OVar2 = IR::Opnd::GetKind(dstOpnd);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_0044c966;
      *puVar5 = 0;
    }
    if ((*(byte *)((long)dstOpnd[1]._vptr_Opnd + 0x19) & 0x20) == 0) {
      return;
    }
    OVar2 = IR::Opnd::GetKind(dstOpnd);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
LAB_0044c966:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (((StackSym *)dstOpnd[1]._vptr_Opnd)->m_type == TyVar) {
      return;
    }
    sym = StackSym::GetVarEquivSym((StackSym *)dstOpnd[1]._vptr_Opnd,(Func *)0x0);
    pRVar6 = this->currentRegion;
    RVar7 = pRVar6->type;
    if (RVar7 == RegionTypeTry) {
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                        (pRVar6->writeThroughSymbolsSet,(sym->super_Sym).m_id);
      if (BVar4 != '\0') goto LAB_0044c928;
      pRVar6 = this->currentRegion;
      RVar7 = pRVar6->type;
    }
    if ((RVar7 == RegionTypeFinally) &&
       (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                          (pRVar6->matchingTryRegion->writeThroughSymbolsSet,(sym->super_Sym).m_id),
       BVar4 != '\0')) {
LAB_0044c928:
      regOpnd = IR::RegOpnd::New(sym,TyVar,instr->m_func);
      ToVar(this,instr->m_next,regOpnd,this->currentBlock,(Value *)0x0,false);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::InsertToVarAtDefInTryRegion(IR::Instr * instr, IR::Opnd * dstOpnd)
{
    if ((this->currentRegion->GetType() == RegionTypeTry || this->currentRegion->GetType() == RegionTypeFinally) &&
        dstOpnd->IsRegOpnd() && dstOpnd->AsRegOpnd()->m_sym->HasByteCodeRegSlot())
    {
        StackSym * sym = dstOpnd->AsRegOpnd()->m_sym;
        if (sym->IsVar())
        {
            return;
        }

        StackSym * varSym = sym->GetVarEquivSym(nullptr);
        if ((this->currentRegion->GetType() == RegionTypeTry && this->currentRegion->writeThroughSymbolsSet->Test(varSym->m_id)) ||
            ((this->currentRegion->GetType() == RegionTypeFinally && this->currentRegion->GetMatchingTryRegion()->writeThroughSymbolsSet->Test(varSym->m_id))))
        {
            IR::RegOpnd * regOpnd = IR::RegOpnd::New(varSym, IRType::TyVar, instr->m_func);
            this->ToVar(instr->m_next, regOpnd, this->currentBlock, NULL, false);
        }
    }
}